

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

char * __thiscall cmState::Directory::GetProperty(Directory *this,string *prop,bool chain)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  PointerType pBVar4;
  _Alloc_hider _Var5;
  Snapshot parent;
  undefined1 local_60 [40];
  Snapshot snp;
  
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar2 != 0)) {
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  std::__cxx11::string::assign
            ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    Snapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
    bVar1 = Snapshot::IsValid(&parent);
    if (!bVar1) {
      return "";
    }
    Snapshot::GetDirectory((Directory *)local_60,&parent);
    pcVar3 = GetCurrentSource((Directory *)local_60);
    return pcVar3;
  }
  bVar1 = std::operator==(prop,"LISTFILE_STACK");
  if (bVar1) {
    parent.Position.Position = 0;
    parent._0_16_ = ZEXT816(0);
    snp.Position.Position = (this->Snapshot_).Position.Position;
    snp.State = (this->Snapshot_).State;
    snp.Position.Tree = (this->Snapshot_).Position.Tree;
    while (bVar1 = Snapshot::IsValid(&snp), bVar1) {
      Snapshot::GetExecutionListFile_abi_cxx11_((string *)local_60,&snp);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parent,
                 (string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      Snapshot::GetCallStackParent((Snapshot *)local_60,&snp);
      snp.Position.Position = local_60._16_8_;
      snp.State = (cmState *)local_60._0_8_;
      snp.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_60._8_8_;
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (parent.State,parent.Position.Tree);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    _Var5 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
  }
  else {
    bVar1 = std::operator==(prop,"CACHE_VARIABLES");
    if (bVar1) {
      GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parent,(this->Snapshot_).State);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_60,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parent,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parent);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    bVar1 = std::operator==(prop,"VARIABLES");
    if (!bVar1) {
      bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar1) {
        parent._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
      }
      else {
        bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar1) {
          parent._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
        }
        else {
          bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
          if (!bVar1) {
            pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                               (&this->DirectoryState);
            pcVar3 = cmPropertyMap::GetPropertyValue(&pBVar4->Properties,prop);
            if (!chain || pcVar3 != (char *)0x0) {
              return pcVar3;
            }
            Snapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
            bVar1 = Snapshot::IsValid(&parent);
            if (bVar1) {
              Snapshot::GetDirectory((Directory *)local_60,&parent);
              pcVar3 = GetProperty((Directory *)local_60,prop,true);
              return pcVar3;
            }
            pcVar3 = GetGlobalProperty((this->Snapshot_).State,prop);
            return pcVar3;
          }
          parent._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
        }
      }
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((string *)local_60,
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&parent,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    Snapshot::ClosureKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,&this->Snapshot_);
    GetCacheEntryKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&snp,(this->Snapshot_).State);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parent,
               (const_iterator)parent.Position.Tree,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )snp.State,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )snp.Position.Tree);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (parent.State,parent.Position.Tree);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_60,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parent,";");
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    _Var5 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&snp);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parent);
  return _Var5._M_p;
}

Assistant:

const char*
cmState::Directory::GetProperty(const std::string& prop, bool chain) const
{
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY")
    {
    cmState::Snapshot parent =
        this->Snapshot_.GetBuildsystemDirectoryParent();
    if(parent.IsValid())
      {
      return parent.GetDirectory().GetCurrentSource();
      }
    return "";
    }
  else if (prop == "LISTFILE_STACK")
    {
    std::vector<std::string> listFiles;
    cmState::Snapshot snp = this->Snapshot_;
    while (snp.IsValid())
      {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
      }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
    }
  else if ( prop == "CACHE_VARIABLES" )
    {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
    }
  else if (prop == "VARIABLES")
    {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
        this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
    }
  else if (prop == "INCLUDE_DIRECTORIES")
    {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
    }
  else if (prop == "COMPILE_OPTIONS")
    {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
    }
  else if (prop == "COMPILE_DEFINITIONS")
    {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
    }

  const char *retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain)
    {
    Snapshot parentSnapshot = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid())
      {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
      }
    return this->Snapshot_.State->GetGlobalProperty(prop);
    }

  return retVal;
}